

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void new_range(int ndim,int *dims,int *lo,int *hi,int *new_lo,int *new_hi)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  if (0 < ndim) {
    uVar2 = 0;
    do {
      iVar1 = lo[uVar2];
      uVar4 = hi[uVar2] - iVar1;
      if (dims[uVar2] <= (int)uVar4) {
        __assert_fail("diff <= dims[dim]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,0x5e,"void new_range(int, int *, int *, int *, int *, int *)");
      }
      iVar3 = dims[uVar2] + ~uVar4;
      if (0 < iVar3) {
        iVar1 = rand();
        iVar1 = iVar1 % iVar3;
      }
      new_lo[uVar2] = iVar1;
      iVar1 = iVar1 + uVar4;
      new_hi[uVar2] = iVar1;
      if (dims[uVar2] <= iVar1) {
        __assert_fail("new_hi[dim] < dims[dim]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,99,"void new_range(int, int *, int *, int *, int *, int *)");
      }
      if (uVar4 != iVar1 - new_lo[uVar2]) {
        __assert_fail("diff == (new_hi[dim] -new_lo[dim]+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,100,"void new_range(int, int *, int *, int *, int *, int *)");
      }
      uVar2 = uVar2 + 1;
    } while ((uint)ndim != uVar2);
  }
  return;
}

Assistant:

void new_range(int ndim, int dims[], int lo[], int hi[],
                             int new_lo[], int new_hi[])
{
    int dim;
    for(dim=0; dim <ndim;dim++){
        int toss, range;
        int diff = hi[dim] -lo[dim]+1;
        assert(diff <= dims[dim]);
                range = dims[dim]-diff;
                toss = (range > 0)? rand()%range : lo[dim];
        new_lo[dim] = toss;
        new_hi[dim] = toss + diff -1;
        assert(new_hi[dim] < dims[dim]);
        assert(diff == (new_hi[dim] -new_lo[dim]+1));
    }
}